

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

int AppendToMemBuffer(WebPIDecoder *idec,uint8_t *data,size_t data_size)

{
  void *pvVar1;
  int iVar2;
  WebPDecBuffer *pWVar3;
  size_t sVar4;
  uint8_t *__n;
  ulong in_RDX;
  void *in_RSI;
  WebPIDecoder *in_RDI;
  uint8_t *new_buf;
  uint64_t extra_size;
  uint64_t new_size;
  size_t current_size;
  size_t new_mem_start;
  uint8_t *old_base;
  uint8_t *old_start;
  int need_compressed_alpha;
  MemBuffer *mem;
  VP8Decoder *dec;
  uint8_t *__src;
  uint8_t *size;
  uint8_t *puVar5;
  undefined4 in_stack_ffffffffffffffc8;
  WebPIDecoder *idec_00;
  int local_4;
  
  pvVar1 = in_RDI->dec_;
  idec_00 = (WebPIDecoder *)&in_RDI->mem_;
  iVar2 = NeedCompressedAlpha(in_RDI);
  if ((idec_00->params_).tmp_v == (uint8_t *)0x0) {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    puVar5 = (idec_00->params_).tmp_v + (long)(idec_00->params_).output;
  }
  __src = puVar5;
  if (iVar2 != 0) {
    __src = *(uint8_t **)((long)pvVar1 + 0xb98);
  }
  if (in_RDX < 0xfffffff7) {
    if ((idec_00->params_).tmp_u < (idec_00->params_).tmp_y + in_RDX) {
      pWVar3 = (WebPDecBuffer *)(puVar5 + -(long)__src);
      size = __src;
      sVar4 = MemDataSize((MemBuffer *)idec_00);
      __n = (uint8_t *)((long)pWVar3->pad + (sVar4 - 0x60));
      puVar5 = (uint8_t *)WebPSafeMalloc((uint64_t)puVar5,(size_t)size);
      if (puVar5 == (uint8_t *)0x0) {
        return 0;
      }
      if (__src != (uint8_t *)0x0) {
        memcpy(puVar5,__src,(size_t)__n);
      }
      WebPSafeFree((void *)0x10bc37);
      (idec_00->params_).tmp_v = puVar5;
      (idec_00->params_).tmp_u = (uint8_t *)((ulong)(__n + in_RDX + 0xfff) & 0xfffffffffffff000);
      (idec_00->params_).output = pWVar3;
      (idec_00->params_).tmp_y = __n;
    }
    memcpy((idec_00->params_).tmp_v + (long)(idec_00->params_).tmp_y,in_RSI,in_RDX);
    (idec_00->params_).tmp_y = (idec_00->params_).tmp_y + in_RDX;
    DoRemap(idec_00,CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int AppendToMemBuffer(WebPIDecoder* const idec,
                             const uint8_t* const data, size_t data_size) {
  VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
  MemBuffer* const mem = &idec->mem_;
  const int need_compressed_alpha = NeedCompressedAlpha(idec);
  const uint8_t* const old_start =
      (mem->buf_ == NULL) ? NULL : mem->buf_ + mem->start_;
  const uint8_t* const old_base =
      need_compressed_alpha ? dec->alpha_data_ : old_start;
  assert(mem->buf_ != NULL || mem->start_ == 0);
  assert(mem->mode_ == MEM_MODE_APPEND);
  if (data_size > MAX_CHUNK_PAYLOAD) {
    // security safeguard: trying to allocate more than what the format
    // allows for a chunk should be considered a smoke smell.
    return 0;
  }

  if (mem->end_ + data_size > mem->buf_size_) {  // Need some free memory
    const size_t new_mem_start = old_start - old_base;
    const size_t current_size = MemDataSize(mem) + new_mem_start;
    const uint64_t new_size = (uint64_t)current_size + data_size;
    const uint64_t extra_size = (new_size + CHUNK_SIZE - 1) & ~(CHUNK_SIZE - 1);
    uint8_t* const new_buf =
        (uint8_t*)WebPSafeMalloc(extra_size, sizeof(*new_buf));
    if (new_buf == NULL) return 0;
    if (old_base != NULL) memcpy(new_buf, old_base, current_size);
    WebPSafeFree(mem->buf_);
    mem->buf_ = new_buf;
    mem->buf_size_ = (size_t)extra_size;
    mem->start_ = new_mem_start;
    mem->end_ = current_size;
  }

  assert(mem->buf_ != NULL);
  memcpy(mem->buf_ + mem->end_, data, data_size);
  mem->end_ += data_size;
  assert(mem->end_ <= mem->buf_size_);

  DoRemap(idec, mem->buf_ + mem->start_ - old_start);
  return 1;
}